

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  TargetType TVar1;
  cmGlobalGenerator *this_00;
  string f;
  string dir;
  string pdbName;
  string impName;
  string realName;
  string name;
  string soName;
  string local_38;
  
  if (this->Target->IsImportedTarget != false) {
    return;
  }
  this_00 = this->LocalGenerator->GlobalGenerator;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  soName._M_dataplus._M_p = (pointer)&soName.field_2;
  soName._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  realName._M_dataplus._M_p = (pointer)&realName.field_2;
  realName._M_string_length = 0;
  impName._M_dataplus._M_p = (pointer)&impName.field_2;
  impName._M_string_length = 0;
  soName.field_2._M_local_buf[0] = '\0';
  realName.field_2._M_local_buf[0] = '\0';
  impName.field_2._M_local_buf[0] = '\0';
  pdbName._M_dataplus._M_p = (pointer)&pdbName.field_2;
  pdbName._M_string_length = 0;
  pdbName.field_2._M_local_buf[0] = '\0';
  TVar1 = this->Target->TargetTypeValue;
  if (TVar1 - STATIC_LIBRARY < 3) {
    GetLibraryNames(this,&name,&soName,&realName,&impName,&pdbName,config);
  }
  else {
    if (TVar1 != EXECUTABLE) goto LAB_002b7830;
    GetExecutableNames(this,&name,&realName,&impName,&pdbName,config);
  }
  GetDirectory(&dir,this,config,RuntimeBinaryArtifact);
  f._M_dataplus._M_p = (pointer)&f.field_2;
  f._M_string_length = 0;
  f.field_2._M_local_buf[0] = '\0';
  if (name._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (soName._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (realName._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (pdbName._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&f);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  if (impName._M_string_length != 0) {
    GetDirectory(&local_38,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=((string *)&f,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::append((char *)&f);
    std::__cxx11::string::append((string *)&f);
    cmGlobalGenerator::AddToManifest(this_00,&f);
  }
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::string::~string((string *)&dir);
LAB_002b7830:
  std::__cxx11::string::~string((string *)&pdbName);
  std::__cxx11::string::~string((string *)&impName);
  std::__cxx11::string::~string((string *)&realName);
  std::__cxx11::string::~string((string *)&soName);
  std::__cxx11::string::~string((string *)&name);
  return;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}